

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::anon_unknown_0::GeneratedMessageReflectionTest_ArenaReleaseMessageTest_Test::
TestBody(GeneratedMessageReflectionTest_ArenaReleaseMessageTest_Test *this)

{
  TestAllTypes *this_00;
  Descriptor *base_descriptor;
  ReflectionTester reflection_tester;
  Arena arena;
  
  internal::ThreadSafeArena::ThreadSafeArena(&arena.impl_);
  this_00 = (TestAllTypes *)
            Arena::DefaultConstruct<proto2_unittest::TestAllTypes>((Arena *)&arena.impl_);
  base_descriptor = proto2_unittest::TestAllTypes::GetDescriptor();
  TestUtil::ReflectionTester::ReflectionTester(&reflection_tester,base_descriptor);
  TestUtil::ReflectionTester::ExpectMessagesReleasedViaReflection
            (&reflection_tester,(Message *)this_00,IS_NULL);
  TestUtil::ReflectionTester::SetAllFieldsViaReflection(&reflection_tester,(Message *)this_00);
  TestUtil::ReflectionTester::ExpectMessagesReleasedViaReflection
            (&reflection_tester,(Message *)this_00,NOT_NULL);
  TestUtil::ReflectionTester::SetAllFieldsViaReflection(&reflection_tester,(Message *)this_00);
  proto2_unittest::TestAllTypes::Clear(this_00);
  TestUtil::ReflectionTester::ExpectMessagesReleasedViaReflection
            (&reflection_tester,(Message *)this_00,CAN_BE_NULL);
  internal::ThreadSafeArena::~ThreadSafeArena(&arena.impl_);
  return;
}

Assistant:

TEST(GeneratedMessageReflectionTest, ArenaReleaseMessageTest) {
  Arena arena;
  unittest::TestAllTypes* message =
      Arena::Create<unittest::TestAllTypes>(&arena);
  TestUtil::ReflectionTester reflection_tester(
      unittest::TestAllTypes::descriptor());

  // When nothing is set, we expect all released messages to be nullptr.
  reflection_tester.ExpectMessagesReleasedViaReflection(
      message, TestUtil::ReflectionTester::IS_NULL);

  // After fields are set we should get non-nullptr releases.
  reflection_tester.SetAllFieldsViaReflection(message);
  reflection_tester.ExpectMessagesReleasedViaReflection(
      message, TestUtil::ReflectionTester::NOT_NULL);

  // After Clear() we may or may not get a message from ReleaseMessage().
  // This is implementation specific.
  reflection_tester.SetAllFieldsViaReflection(message);
  message->Clear();
  reflection_tester.ExpectMessagesReleasedViaReflection(
      message, TestUtil::ReflectionTester::CAN_BE_NULL);
}